

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmSignature.cpp
# Opt level: O0

uint32 __thiscall
Wasm::WasmSignature::WriteSignatureToString(WasmSignature *this,char16 *out,uint32 maxlen)

{
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint uVar6;
  int iVar7;
  Local LVar8;
  undefined4 *puVar9;
  char16 *pcVar10;
  uint local_3c;
  uint local_38;
  uint32 i_2;
  uint32 i_1;
  ArgSlot i;
  uint32 numwritten;
  uint32 minEnd;
  bool hasMultiResults;
  uint32 maxlen_local;
  char16 *out_local;
  WasmSignature *this_local;
  
  uVar4 = GetResultCount(this);
  uVar5 = GetResultCount(this);
  uVar6 = 0xc;
  if (1 < uVar5) {
    uVar6 = 0x14;
  }
  if (maxlen <= uVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmSignature.cpp"
                       ,0xf4,"(maxlen > minEnd)","maxlen > minEnd");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (out == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmSignature.cpp"
                       ,0xf5,"(out != nullptr)","out != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  i_1 = _snwprintf_unsafe(out,(ulong)maxlen,0xffffffffffffffff,L"(");
  for (i_2._2_2_ = 0; AVar3 = GetParamCount(this), i_2._2_2_ < AVar3; i_2._2_2_ = i_2._2_2_ + 1) {
    if (i_2._2_2_ != 0) {
      iVar7 = _snwprintf_unsafe(out + i_1,(ulong)(maxlen - i_1),0xffffffffffffffff,L", ");
      i_1 = iVar7 + i_1;
    }
    LVar8 = GetParam(this,i_2._2_2_);
    pcVar10 = WasmTypes::GetTypeName(LVar8);
    iVar7 = _snwprintf_unsafe(out + i_1,(ulong)(maxlen - i_1),0xffffffffffffffff,L"%ls",pcVar10);
    i_1 = iVar7 + i_1;
  }
  if (maxlen - uVar6 <= i_1) {
    for (local_38 = 1; local_38 <= uVar6; local_38 = local_38 + 1) {
      out[(ulong)maxlen - (ulong)local_38] = L'\0';
    }
    if (i_1 < uVar6) {
      i_1 = 0;
    }
    else {
      i_1 = i_1 - uVar6;
    }
    iVar7 = _snwprintf_unsafe(out + i_1,(ulong)(maxlen - i_1),0xffffffffffffffff,L"...");
    i_1 = iVar7 + i_1;
    if (1 < uVar4) {
      LVar8 = GetResult(this,0);
      pcVar10 = WasmTypes::GetTypeName(LVar8);
      iVar7 = _snwprintf_unsafe(out + i_1,(ulong)(maxlen - i_1),0xffffffffffffffff,L")->(%s, ...)",
                                pcVar10);
      return iVar7 + i_1;
    }
  }
  uVar4 = GetResultCount(this);
  if (uVar4 == 0) {
    iVar7 = _snwprintf_unsafe(out + i_1,(ulong)(maxlen - i_1),0xffffffffffffffff,L")->void");
    i_1 = iVar7 + i_1;
  }
  else {
    uVar4 = GetResultCount(this);
    if (uVar4 == 1) {
      LVar8 = GetResult(this,0);
      pcVar10 = WasmTypes::GetTypeName(LVar8);
      iVar7 = _snwprintf_unsafe(out + i_1,(ulong)(maxlen - i_1),0xffffffffffffffff,L")->%ls",pcVar10
                               );
      i_1 = iVar7 + i_1;
    }
    else {
      iVar7 = _snwprintf_unsafe(out + i_1,(ulong)(maxlen - i_1),0xffffffffffffffff,L")->(");
      i_1 = iVar7 + i_1;
      for (local_3c = 0; uVar4 = GetResultCount(this), local_3c < uVar4; local_3c = local_3c + 1) {
        if (local_3c != 0) {
          iVar7 = _snwprintf_unsafe(out + i_1,(ulong)(maxlen - i_1),0xffffffffffffffff,L", ");
          i_1 = iVar7 + i_1;
        }
        LVar8 = GetResult(this,local_3c);
        pcVar10 = WasmTypes::GetTypeName(LVar8);
        iVar7 = _snwprintf_unsafe(out + i_1,(ulong)(maxlen - i_1),0xffffffffffffffff,L"%ls",pcVar10)
        ;
        i_1 = iVar7 + i_1;
      }
      iVar7 = _snwprintf_unsafe(out + i_1,(ulong)(maxlen - i_1),0xffffffffffffffff,L")");
      i_1 = iVar7 + i_1;
    }
  }
  return i_1;
}

Assistant:

uint32 WasmSignature::WriteSignatureToString(_Out_writes_(maxlen) char16* out, uint32 maxlen)
{
    bool hasMultiResults = GetResultCount() > 1;
    const uint32 minEnd = GetResultCount() > 1 ? 20 : 12;
    AssertOrFailFast(maxlen > minEnd);
    AssertOrFailFast(out != nullptr);
    uint32 numwritten = 0;
#define WRITE_BUF(msg, ...) numwritten += _snwprintf_s(out+numwritten, maxlen-numwritten, _TRUNCATE, msg, ##__VA_ARGS__);
    WRITE_BUF(_u("("));
    for (Js::ArgSlot i = 0; i < GetParamCount(); i++)
    {
        if (i != 0)
        {
            WRITE_BUF(_u(", "));
        }
        WRITE_BUF(_u("%ls"), WasmTypes::GetTypeName(this->GetParam(i)));
    }
    if (numwritten >= maxlen - minEnd) {
        // null out the last 12 characters so we can properly end it 
        for (uint32 i = 1; i <= minEnd; i++)
        {
            *(out + maxlen - i) = 0;
        }
        if (numwritten < minEnd)
        {
            numwritten = 0;
        }
        else
        {
            numwritten -= minEnd;
        }

        WRITE_BUF(_u("..."));
        if (hasMultiResults)
        {
            // If the signature has multiple results, just print the first one then terminate.
            WRITE_BUF(_u(")->(%s, ...)"), WasmTypes::GetTypeName(this->GetResult(0)));
            return numwritten;
        }
    }
    if (GetResultCount() == 0)
    {
        WRITE_BUF(_u(")->void"));
    }
    else if (GetResultCount() == 1)
    {
        WRITE_BUF(_u(")->%ls"), WasmTypes::GetTypeName(this->GetResult(0)));
    }
    else
    {
        WRITE_BUF(_u(")->("));
        for (uint32 i = 0; i < GetResultCount(); i++)
        {
            if (i != 0)
            {
                WRITE_BUF(_u(", "));
            }
            WRITE_BUF(_u("%ls"), WasmTypes::GetTypeName(this->GetResult(i)));
        }
        WRITE_BUF(_u(")"));
    }
#undef WRITE_BUF
    return numwritten;
}